

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlWarningMsg(xmlParserCtxtPtr ctxt,xmlParserErrors error,char *msg,xmlChar *str1,xmlChar *str2
                  )

{
  _xmlSAXHandler *p_Var1;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    schannel = (xmlStructuredErrorFunc)0x0;
    channel = (xmlGenericErrorFunc)0x0;
    data = (void *)0x0;
    ctxt = (xmlParserCtxtPtr)0x0;
  }
  else {
    if ((ctxt->disableSAX != 0) && (ctxt->instate == XML_PARSER_EOF)) {
      return;
    }
    p_Var1 = ctxt->sax;
    if (p_Var1 == (_xmlSAXHandler *)0x0) {
      schannel = (xmlStructuredErrorFunc)0x0;
      channel = (xmlGenericErrorFunc)0x0;
    }
    else {
      if (p_Var1->initialized == 0xdeedbeaf) {
        schannel = p_Var1->serror;
      }
      else {
        schannel = (xmlStructuredErrorFunc)0x0;
      }
      channel = p_Var1->warning;
    }
    data = ctxt->userData;
  }
  __xmlRaiseError(schannel,channel,data,ctxt,(void *)0x0,1,error,XML_ERR_WARNING,(char *)0x0,0,
                  (char *)str1,(char *)0x0,(char *)0x0,0,0,msg,str1,0);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlWarningMsg(xmlParserCtxtPtr ctxt, xmlParserErrors error,
              const char *msg, const xmlChar *str1, const xmlChar *str2)
{
    xmlStructuredErrorFunc schannel = NULL;

    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if ((ctxt != NULL) && (ctxt->sax != NULL) &&
        (ctxt->sax->initialized == XML_SAX2_MAGIC))
        schannel = ctxt->sax->serror;
    if (ctxt != NULL) {
        __xmlRaiseError(schannel,
                    (ctxt->sax) ? ctxt->sax->warning : NULL,
                    ctxt->userData,
                    ctxt, NULL, XML_FROM_PARSER, error,
                    XML_ERR_WARNING, NULL, 0,
		    (const char *) str1, (const char *) str2, NULL, 0, 0,
		    msg, (const char *) str1, (const char *) str2);
    }